

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

int stbir__edge_reflect_full(int n,int max)

{
  int iVar1;
  
  if (-1 < n) {
    iVar1 = n;
    if ((max <= n) && (iVar1 = ~n + max * 2, max * 2 <= n)) {
      iVar1 = 0;
    }
    return iVar1;
  }
  if (-max < n) {
    return -n;
  }
  return max + -1;
}

Assistant:

static int stbir__edge_reflect_full( int n, int max )
{
  if (n < 0)
  {
    if (n > -max)
      return -n;
    else
      return max - 1;
  }

  if (n >= max)
  {
    int max2 = max * 2;
    if (n >= max2)
      return 0;
    else
      return max2 - n - 1;
  }

  return n; // NOTREACHED
}